

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O2

void __thiscall
directed_flag_complex_in_memory_t<std::pair<int,_float>_>::
for_each_cell<directed_flag_complex_in_memory_computer::reorder_edges_t>
          (directed_flag_complex_in_memory_t<std::pair<int,_float>_> *this,
          vector<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
          *fs,int min_dimension,int max_dimension)

{
  ulong uVar1;
  int thread_id;
  int i;
  long lVar2;
  int local_80;
  int number_of_threads;
  int local_78;
  int min_dimension_local;
  reference_wrapper<directed_flag_complex_in_memory_computer::reorder_edges_t> local_70;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_68;
  code *local_60;
  undefined8 local_58;
  vector<std::thread,_std::allocator<std::thread>_> t;
  thread local_38;
  
  if (max_dimension == -1) {
    max_dimension = min_dimension;
  }
  uVar1 = ((long)(fs->
                 super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(fs->
                super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  number_of_threads = (int)uVar1;
  local_78 = max_dimension;
  min_dimension_local = min_dimension;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&t,(long)number_of_threads,(allocator_type *)&local_60);
  local_80 = 0;
  while( true ) {
    thread_id = (int)uVar1 + -1;
    if (thread_id <= local_80) break;
    local_60 = worker_thread<directed_flag_complex_in_memory_computer::reorder_edges_t>;
    local_58 = 0;
    local_70._M_data =
         (fs->
         super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
         )._M_impl.super__Vector_impl_data._M_start + local_80;
    local_68 = this;
    std::thread::
    thread<void(directed_flag_complex_in_memory_t<std::pair<int,float>>::*)(int,int,directed_flag_complex_in_memory_computer::reorder_edges_t&,int,int),directed_flag_complex_in_memory_t<std::pair<int,float>>*,int&,int&,std::reference_wrapper<directed_flag_complex_in_memory_computer::reorder_edges_t>,int&,int&,void>
              (&local_38,(type *)&local_60,&local_68,&number_of_threads,&local_80,&local_70,
               &min_dimension_local,&local_78);
    std::thread::operator=
              (t.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start + local_80,&local_38);
    std::thread::~thread(&local_38);
    local_80 = local_80 + 1;
    uVar1 = (ulong)(uint)number_of_threads;
  }
  worker_thread<directed_flag_complex_in_memory_computer::reorder_edges_t>
            (this,(int)uVar1,thread_id,
             (fs->
             super__Vector_base<directed_flag_complex_in_memory_computer::reorder_edges_t,_std::allocator<directed_flag_complex_in_memory_computer::reorder_edges_t>_>
             )._M_impl.super__Vector_impl_data._M_start + thread_id,min_dimension_local,local_78);
  for (lVar2 = 0; lVar2 < (long)number_of_threads + -1; lVar2 = lVar2 + 1) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&t);
  return;
}

Assistant:

void for_each_cell(std::vector<Func>& fs, int min_dimension, int max_dimension = -1) {
		if (max_dimension == -1) max_dimension = min_dimension;

		auto number_of_threads = int(fs.size());
		std::vector<std::thread> t(number_of_threads);

		for (auto index = 0; index < number_of_threads - 1; ++index)
			t[index] = std::thread(&directed_flag_complex_in_memory_t<ExtraData>::worker_thread<Func>, this,
			                       number_of_threads, index, std::ref(fs[index]), min_dimension, max_dimension);

		// Also do work in this thread, namely the last bit
		worker_thread(number_of_threads, number_of_threads - 1, fs[number_of_threads - 1], min_dimension,
		              max_dimension);

		// Wait until all threads stopped
		for (auto i = 0; i < number_of_threads - 1; ++i) t[i].join();
	}